

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void add_objunit(GlobalVars *gv,ObjectUnit *ou,bool fixrelocs)

{
  byte bVar1;
  uint id;
  char *pcVar2;
  node *pnVar3;
  Section *pSVar4;
  char *pcVar5;
  node *pnVar6;
  list *l;
  node *pnVar7;
  
  if (ou == (ObjectUnit *)0x0) {
    return;
  }
  bVar1 = ou->lnkfile->type;
  if (bVar1 - 1 < 2) {
LAB_0010ff4e:
    *(byte *)&ou->flags = (byte)ou->flags | 1;
    l = &gv->selobjects;
  }
  else if (bVar1 == 4) {
    l = &gv->sharedobjects;
  }
  else {
    if (bVar1 != 8) {
      ierror("add_objunit(): Link File type = %d");
      goto LAB_0010ff86;
    }
    if (gv->whole_archive != 0) goto LAB_0010ff4e;
    l = &gv->libobjects;
  }
  addtail(l,&ou->n);
LAB_0010ff86:
  if (fixrelocs != 0) {
    pnVar7 = (node *)&ou->sections;
    while (pnVar7 = pnVar7->next, pnVar7->next != (node *)0x0) {
      pnVar6 = pnVar7 + 6;
      while (pnVar6 = pnVar6->next, pnVar6->next != (node *)0x0) {
        id = *(uint *)&pnVar6[1].pred;
        pSVar4 = find_sect_id(ou,id);
        pnVar6[1].pred = &pSVar4->n;
        if (pSVar4 == (Section *)0x0) {
          pcVar2 = ou->lnkfile->pathname;
          pnVar3 = pnVar7[2].next;
          pcVar5 = getobjname(ou);
          error(0x34,pcVar2,pnVar3,pcVar5,(ulong)id);
        }
      }
    }
  }
  return;
}

Assistant:

void add_objunit(struct GlobalVars *gv,struct ObjectUnit *ou,bool fixrelocs)
/* adds an ObjectUnit to the approriate list */
{
  if (ou) {
    uint8_t t = ou->lnkfile->type;

    if (t==ID_LIBARCH && gv->whole_archive)
      t = ID_OBJECT;  /* force linking of a whole archive */

    switch (t) {
      case ID_OBJECT:
      case ID_EXECUTABLE:
        ou->flags |= OUF_LINKED;  /* objects are always linked */
        addtail(&gv->selobjects,&ou->n);
        break;
      case ID_LIBARCH:
        addtail(&gv->libobjects,&ou->n);
        break;
      case ID_SHAREDOBJ:
        addtail(&gv->sharedobjects,&ou->n);
        break;
      default:
        ierror("add_objunit(): Link File type = %d",
               (int)ou->lnkfile->type);
    }

    if (fixrelocs) {  /* convert section index into address */
      struct Section *sec;
      struct Reloc *r;
      uint32_t idx;

      for (sec=(struct Section *)ou->sections.first;
           sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
        for (r=(struct Reloc *)sec->relocs.first;
             r->n.next!=NULL; r=(struct Reloc *)r->n.next) {
          idx = r->relocsect.id;
          if ((r->relocsect.ptr = find_sect_id(ou,idx)) == NULL) {
            /* section with this index doesn't exist */
            error(52,ou->lnkfile->pathname,sec->name,getobjname(ou),(int)idx);
          }
        }
      }
    }
  }
}